

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int cmocka_run_one_test_or_fixture
              (char *function_name,CMUnitTestFunction test_func,CMFixtureFunction setup_func,
              CMFixtureFunction teardown_func,void **state,void *heap_check_point)

{
  int iVar1;
  __sighandler_t p_Var2;
  code *in_RCX;
  code *in_RDX;
  code *in_RSI;
  ListNode *in_R8;
  long in_R9;
  long *in_FS_OFFSET;
  uint i_1;
  uint i;
  int rc;
  int handle_exceptions;
  ListNode *check_point;
  void *current_state;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ListNode *in_stack_ffffffffffffff70;
  ListNode *local_80;
  ListNode *local_70;
  uint local_58;
  uint local_54;
  int local_50;
  void *local_10;
  long local_8;
  
  local_8 = in_FS_OFFSET[5];
  if (in_R9 == 0) {
    check_point_allocated_blocks();
  }
  local_10 = (void *)0x0;
  local_50 = 0;
  for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
    p_Var2 = signal(exception_signals[local_54],exception_handler);
    default_signal_functions[local_54] = (SignalFunction)p_Var2;
  }
  initialize_testing((char *)0x1739b2);
  *(undefined4 *)(*in_FS_OFFSET + -0x108) = 1;
  iVar1 = __sigsetjmp(*in_FS_OFFSET + -0x100,1);
  if (iVar1 == 0) {
    if (in_RSI == (code *)0x0) {
      if (in_RDX == (code *)0x0) {
        if (in_RCX != (code *)0x0) {
          if (in_R8 == (ListNode *)0x0) {
            in_R8 = (ListNode *)&stack0xfffffffffffffff0;
          }
          local_50 = (*in_RCX)(in_R8);
          fail_if_blocks_allocated
                    (in_R8,(char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          in_stack_ffffffffffffff70 = in_R8;
        }
      }
      else {
        local_80 = in_R8;
        if (in_R8 == (ListNode *)0x0) {
          local_80 = (ListNode *)&stack0xfffffffffffffff0;
        }
        local_50 = (*in_RDX)(local_80);
      }
    }
    else {
      local_70 = in_R8;
      if (in_R8 == (ListNode *)0x0) {
        local_70 = (ListNode *)&stack0xfffffffffffffff0;
      }
      (*in_RSI)(local_70);
      fail_if_blocks_allocated
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_50 = 0;
    }
    fail_if_leftover_values((char *)in_stack_ffffffffffffff70);
    *(undefined4 *)(*in_FS_OFFSET + -0x108) = 0;
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0x108) = 0;
    local_50 = -1;
  }
  teardown_testing((char *)0x173b56);
  for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
    signal(exception_signals[local_58],(__sighandler_t)default_signal_functions[local_58]);
  }
  if (in_FS_OFFSET[5] == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

static int cmocka_run_one_test_or_fixture(const char *function_name,
                                          CMUnitTestFunction test_func,
                                          CMFixtureFunction setup_func,
                                          CMFixtureFunction teardown_func,
                                          void ** const volatile state,
                                          const void *const heap_check_point)
{
    const ListNode * const volatile check_point = (const ListNode*)
        (heap_check_point != NULL ?
         heap_check_point : check_point_allocated_blocks());
    int handle_exceptions = 1;
    void *current_state = NULL;
    int rc = 0;

    /* FIXME check only one test or fixture is set */

    /* Detect if we should handle exceptions */
#ifdef _WIN32
    handle_exceptions = !IsDebuggerPresent();
#endif /* _WIN32 */
#ifdef UNIT_TESTING_DEBUG
    handle_exceptions = 0;
#endif /* UNIT_TESTING_DEBUG */


    if (handle_exceptions) {
#ifndef _WIN32
        unsigned int i;
        for (i = 0; i < ARRAY_SIZE(exception_signals); i++) {
            default_signal_functions[i] = signal(
                    exception_signals[i], exception_handler);
        }
#else /* _WIN32 */
        previous_exception_filter = SetUnhandledExceptionFilter(
                exception_filter);
#endif /* !_WIN32 */
    }

    /* Init the test structure */
    initialize_testing(function_name);

    global_running_test = 1;

    if (cm_setjmp(global_run_test_env) == 0) {
        if (test_func != NULL) {
            test_func(state != NULL ? state : &current_state);

            fail_if_blocks_allocated(check_point, function_name);
            rc = 0;
        } else if (setup_func != NULL) {
            rc = setup_func(state != NULL ? state : &current_state);

            /*
             * For setup we can ignore any allocated blocks. We just need to
             * ensure they're deallocated on tear down.
             */
        } else if (teardown_func != NULL) {
            rc = teardown_func(state != NULL ? state : &current_state);

            fail_if_blocks_allocated(check_point, function_name);
        } else {
            /* ERROR */
        }
        fail_if_leftover_values(function_name);
        global_running_test = 0;
    } else {
        /* TEST FAILED */
        global_running_test = 0;
        rc = -1;
    }
    teardown_testing(function_name);

    if (handle_exceptions) {
#ifndef _WIN32
        unsigned int i;
        for (i = 0; i < ARRAY_SIZE(exception_signals); i++) {
            signal(exception_signals[i], default_signal_functions[i]);
        }
#else /* _WIN32 */
        if (previous_exception_filter) {
            SetUnhandledExceptionFilter(previous_exception_filter);
            previous_exception_filter = NULL;
        }
#endif /* !_WIN32 */
    }

    return rc;
}